

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_analytic_nonlin.c
# Opt level: O1

int main(void)

{
  uint uVar1;
  long *plVar2;
  FILE *pFVar3;
  char *pcVar4;
  double dVar5;
  sunrealtype t;
  void *arkode_mem;
  SUNContext ctx;
  double local_50;
  long local_48;
  undefined8 local_40;
  double local_38;
  
  local_48 = 0;
  uVar1 = SUNContext_Create(0,&local_40);
  if ((int)uVar1 < 0) {
    pcVar4 = "SUNContext_Create";
  }
  else {
    puts("\nAnalytical ODE test problem:");
    printf("   reltol = %.1e\n",0x3eb0c6f7a0b5ed8d);
    printf("   abstol = %.1e\n\n",0x3ddb7cdfd9d7bdbb);
    plVar2 = (long *)N_VNew_Serial(1,local_40);
    if (plVar2 == (long *)0x0) {
      main_cold_2();
      return 1;
    }
    **(undefined8 **)(*plVar2 + 0x10) = 0;
    local_48 = ERKStepCreate(0,f,plVar2,local_40);
    if (local_48 == 0) {
      main_cold_1();
      return 1;
    }
    uVar1 = ARKodeSStolerances(0x3eb0c6f7a0b5ed8d,0x3ddb7cdfd9d7bdbb,local_48);
    if (-1 < (int)uVar1) {
      pFVar3 = fopen("solution.txt","w");
      fwrite("# t u\n",6,1,pFVar3);
      fprintf(pFVar3," %.16e %.16e\n",0,**(undefined8 **)(*plVar2 + 0x10));
      local_50 = 0.0;
      puts("        t           u");
      puts("   ---------------------");
      if (1e-15 < 10.0 - local_50) {
        dVar5 = 1.0;
        do {
          local_38 = dVar5;
          uVar1 = ARKodeEvolve(local_48,plVar2,&local_50,1);
          if ((int)uVar1 < 0) {
            fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n","ARKodeEvolve",
                    (ulong)uVar1);
            break;
          }
          printf("  %10.6f  %10.6f\n",local_50,**(undefined8 **)(*plVar2 + 0x10));
          fprintf(pFVar3," %.16e %.16e\n",local_50,**(undefined8 **)(*plVar2 + 0x10));
          dVar5 = 10.0;
          if (local_38 + 1.0 <= 10.0) {
            dVar5 = local_38 + 1.0;
          }
        } while (1e-15 < 10.0 - local_50);
      }
      puts("   ---------------------");
      fclose(pFVar3);
      puts("\nFinal Statistics:");
      ARKodePrintAllStats(local_48,_stdout,0);
      pFVar3 = fopen("ark_analytic_nonlin_stats.csv","w");
      ARKodePrintAllStats(local_48,pFVar3,1);
      fclose(pFVar3);
      N_VDestroy(plVar2);
      ARKodeFree(&local_48);
      SUNContext_Free(&local_40);
      return 0;
    }
    pcVar4 = "ARKodeSStolerances";
  }
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",pcVar4,(ulong)uVar1);
  return 1;
}

Assistant:

int main(void)
{
  /* general problem parameters */
  sunrealtype T0     = SUN_RCONST(0.0);  /* initial time */
  sunrealtype Tf     = SUN_RCONST(10.0); /* final time */
  sunrealtype dTout  = SUN_RCONST(1.0);  /* time between outputs */
  sunindextype NEQ   = 1;                /* number of dependent vars. */
  sunrealtype reltol = 1.0e-6;           /* tolerances */
  sunrealtype abstol = 1.0e-10;

  /* general problem variables */
  int flag;                /* reusable error-checking flag */
  N_Vector y       = NULL; /* empty vector for storing solution */
  void* arkode_mem = NULL; /* empty ARKode memory structure */
  FILE *UFID, *FID;
  sunrealtype t, tout;

  /* Create the SUNDIALS context object for this simulation */
  SUNContext ctx;
  flag = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_flag(&flag, "SUNContext_Create", 1)) { return 1; }

  /* Initial problem output */
  printf("\nAnalytical ODE test problem:\n");
  printf("   reltol = %.1" ESYM "\n", reltol);
  printf("   abstol = %.1" ESYM "\n\n", abstol);

  /* Initialize data structures */
  y = N_VNew_Serial(NEQ, ctx); /* Create serial vector for solution */
  if (check_flag((void*)y, "N_VNew_Serial", 0)) { return 1; }
  NV_Ith_S(y, 0) = 0.0; /* Specify initial condition */

  /* Call ERKStepCreate to initialize the ERK timestepper module and
     specify the right-hand side function in y'=f(t,y), the initial time
     T0, and the initial dependent variable vector y. */
  arkode_mem = ERKStepCreate(f, T0, y, ctx);
  if (check_flag((void*)arkode_mem, "ERKStepCreate", 0)) { return 1; }

  /* Specify tolerances */
  flag = ARKodeSStolerances(arkode_mem, reltol, abstol);
  if (check_flag(&flag, "ARKodeSStolerances", 1)) { return 1; }

  /* Open output stream for results, output comment line */
  UFID = fopen("solution.txt", "w");
  fprintf(UFID, "# t u\n");

  /* output initial condition to disk */
  fprintf(UFID, " %.16" ESYM " %.16" ESYM "\n", T0, NV_Ith_S(y, 0));

  /* Main time-stepping loop: calls ARKodeEvolve to perform the integration, then
     prints results.  Stops when the final time has been reached */
  t    = T0;
  tout = T0 + dTout;
  printf("        t           u\n");
  printf("   ---------------------\n");
  while (Tf - t > 1.0e-15)
  {
    flag = ARKodeEvolve(arkode_mem, tout, y, &t, ARK_NORMAL); /* call integrator */
    if (check_flag(&flag, "ARKodeEvolve", 1)) { break; }
    printf("  %10.6" FSYM "  %10.6" FSYM "\n", t,
           NV_Ith_S(y, 0)); /* access/print solution */
    fprintf(UFID, " %.16" ESYM " %.16" ESYM "\n", t, NV_Ith_S(y, 0));
    if (flag >= 0)
    { /* successful solve: update time */
      tout += dTout;
      tout = (tout > Tf) ? Tf : tout;
    }
    else
    { /* unsuccessful solve: break */
      fprintf(stderr, "Solver failure, stopping integration\n");
      break;
    }
  }
  printf("   ---------------------\n");
  fclose(UFID);

  /* Print final statistics */
  printf("\nFinal Statistics:\n");
  flag = ARKodePrintAllStats(arkode_mem, stdout, SUN_OUTPUTFORMAT_TABLE);

  /* Print final statistics to a file in CSV format */
  FID  = fopen("ark_analytic_nonlin_stats.csv", "w");
  flag = ARKodePrintAllStats(arkode_mem, FID, SUN_OUTPUTFORMAT_CSV);
  fclose(FID);

  /* Clean up and return with successful completion */
  N_VDestroy(y);           /* Free y vector */
  ARKodeFree(&arkode_mem); /* Free integrator memory */
  SUNContext_Free(&ctx);   /* Free context */

  return 0;
}